

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O1

char * duckdb_re2::re2_internal::TerminateNumber
                 (char *buf,size_t nbuf,char *str,size_t *np,bool accept_spaces)

{
  ulong __n;
  int iVar1;
  uint uVar2;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  
  sVar4 = *np;
  pcVar5 = anon_var_dwarf_647c332 + 9;
  if (sVar4 == 0) {
    return pcVar5;
  }
  iVar1 = isspace((int)*str);
  if (iVar1 != 0) {
    if (!accept_spaces) {
      return pcVar5;
    }
    pcVar3 = str + sVar4;
    do {
      iVar1 = isspace((int)*str);
      if (iVar1 == 0) goto LAB_011e4bd3;
      str = str + 1;
      sVar4 = sVar4 - 1;
    } while (sVar4 != 0);
    sVar4 = 0;
    str = pcVar3;
  }
LAB_011e4bd3:
  if (sVar4 == 0) {
    sVar4 = 0;
  }
  else if (*str == '-') {
    sVar4 = sVar4 - 1;
    str = str + 1;
    uVar2 = 1;
    goto LAB_011e4bed;
  }
  uVar2 = 0;
LAB_011e4bed:
  if (((2 < sVar4) && (*str == '0')) && (str[1] == '0')) {
    pcVar3 = str + (sVar4 - 2);
    do {
      if (str[2] != '0') goto LAB_011e4c24;
      sVar4 = sVar4 - 1;
      str = str + 1;
    } while (2 < sVar4);
    sVar4 = 2;
    str = pcVar3;
  }
LAB_011e4c24:
  __n = sVar4 + uVar2;
  if (__n <= nbuf - 1) {
    memmove(buf,str + -(ulong)uVar2,__n);
    if ((char)uVar2 != '\0') {
      *buf = '-';
    }
    buf[__n] = '\0';
    *np = __n;
    pcVar5 = buf;
  }
  return pcVar5;
}

Assistant:

static const char* TerminateNumber(char* buf, size_t nbuf, const char* str,
                                   size_t* np, bool accept_spaces) {
  size_t n = *np;
  if (n == 0) return "";
  if (n > 0 && isspace(*str)) {
    // We are less forgiving than the strtoxxx() routines and do not
    // allow leading spaces. We do allow leading spaces for floats.
    if (!accept_spaces) {
      return "";
    }
    while (n > 0 && isspace(*str)) {
      n--;
      str++;
    }
  }

  // Although buf has a fixed maximum size, we can still handle
  // arbitrarily large integers correctly by omitting leading zeros.
  // (Numbers that are still too long will be out of range.)
  // Before deciding whether str is too long,
  // remove leading zeros with s/000+/00/.
  // Leaving the leading two zeros in place means that
  // we don't change 0000x123 (invalid) into 0x123 (valid).
  // Skip over leading - before replacing.
  bool neg = false;
  if (n >= 1 && str[0] == '-') {
    neg = true;
    n--;
    str++;
  }

  if (n >= 3 && str[0] == '0' && str[1] == '0') {
    while (n >= 3 && str[2] == '0') {
      n--;
      str++;
    }
  }

  if (neg) {  // make room in buf for -
    n++;
    str--;
  }

  if (n > nbuf-1) return "";

  memmove(buf, str, n);
  if (neg) {
    buf[0] = '-';
  }
  buf[n] = '\0';
  *np = n;
  return buf;
}